

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall
QPDFJob::handlePageSpecs
          (QPDFJob *this,QPDF *pdf,
          vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
          *page_heap)

{
  mapped_type pQVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_color _Var3;
  pointer pPVar4;
  char *pcVar5;
  size_t __n;
  QPDF *this_00;
  QPDFObjGen QVar6;
  pointer puVar7;
  pointer puVar8;
  unsigned_long *__args;
  iterator __position;
  void *pvVar9;
  pointer pcVar10;
  QPDFObjectHandle *pQVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  pointer __first;
  size_type sVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pointer pQVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  mapped_type *ppQVar19;
  const_iterator cVar20;
  ClosedFileInputSource *pCVar21;
  QPDFObjGen *pQVar22;
  mapped_type *ppCVar23;
  element_type *peVar24;
  const_iterator cVar25;
  mapped_type_conflict1 *pmVar26;
  _Rb_tree_node_base *this_02;
  _Rb_tree_node_base *p_Var27;
  ulong uVar28;
  pointer pQVar29;
  ClosedFileInputSource *pCVar30;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_03;
  const_iterator cVar31;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_04;
  QPDFObjGen QVar32;
  reference this_05;
  int *__args_1;
  _Tp_alloc_type *__a;
  _Base_ptr p_Var33;
  ClosedFileInputSource *pCVar34;
  long lVar35;
  _Base_ptr p_Var36;
  PageSpec *page_spec;
  pointer pPVar37;
  char *pcVar38;
  long lVar39;
  ulong uVar40;
  QPDFObjGen __a_00;
  long lVar41;
  _Base_ptr p_Var42;
  _Base_ptr p_Var43;
  _Base_ptr p_Var44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  *this_06;
  int *piVar45;
  _Rb_tree_header *p_Var46;
  ulong uVar47;
  QPDFObjGen QVar48;
  byte bVar49;
  pointer pQVar50;
  _Rb_tree_node_base *__n_00;
  _Alloc_hider _Var51;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  int pageno;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cur_page;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  parsed_specs;
  QPDFObjectHandle fields;
  QPDFPageLabelDocumentHelper pldh;
  unsigned_long_long from_uuid;
  QPDFObjectHandle new_page;
  QPDFObjGen to_copy_og;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> orig_pages;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_labels;
  set<int,_std::less<int>,_std::allocator<int>_> selected_from_orig;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  page_spec_qpdfs;
  QPDFPageDocumentHelper dh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  page_spec_cfis;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> referenced_fields;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh_map;
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  remove_unreferenced;
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  copied_pages;
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_508;
  element_type *local_500;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f8;
  QPDFJob *local_4f0;
  ClosedFileInputSource *local_4e8;
  ClosedFileInputSource *local_4e0;
  QPDFObjectHandle *local_4d8;
  int local_4cc;
  QPDFFormFieldObjectHelper local_4c8;
  ClosedFileInputSource *local_490;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  local_488;
  QPDFObjGen local_468;
  ClosedFileInputSource *local_460;
  QPDFObjectHandle local_458 [2];
  string local_438;
  QPDFObjectHandle local_418 [2];
  ulong local_3f0;
  _Rb_tree_node_base *local_3e8;
  unsigned_long_long local_3e0;
  QPDFArrayItems local_3d8 [2];
  QPDFObjGen local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  QPDFObjGen local_3a8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_3a0;
  QPDFObjGen local_388;
  QPDFObjGen local_380;
  QPDFObjectHandle local_378;
  QPDFObjectHandle local_368;
  QPDFObjectHandle local_358;
  shared_ptr<InputSource> local_348;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_2f8;
  ClosedFileInputSource *local_2e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  local_2a8;
  QPDFPageObjectHelper local_278;
  QPDFObjectHandle local_240;
  _Rb_tree_node_base local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  local_210;
  QPDFPageObjectHelper local_1e0;
  QPDFPageObjectHelper local_1a8;
  QPDFPageObjectHelper local_170;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_f0;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  local_c0;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  local_90;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  local_60;
  
  peVar24 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar37 = (peVar24->page_specs).
            super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar4 = *(pointer *)
            ((long)&(peVar24->page_specs).
                    super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                    _M_impl.super__Vector_impl_data + 8);
  local_4f0 = this;
  local_4e0 = (ClosedFileInputSource *)page_heap;
  local_4d8 = (QPDFObjectHandle *)pdf;
  if (pPVar37 != pPVar4) {
    do {
      iVar18 = std::__cxx11::string::compare((char *)pPVar37);
      if (iVar18 == 0) {
        pcVar38 = (((local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pcVar5 = (char *)(pPVar37->filename)._M_string_length;
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strlen(pcVar38)
        ;
        std::__cxx11::string::_M_replace((ulong)pPVar37,0,pcVar5,(ulong)pcVar38);
      }
      if ((pPVar37->range)._M_string_length == 0) {
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        std::__cxx11::string::_M_replace((ulong)&pPVar37->range,0,(char *)0x0,0x2651a9);
      }
      pPVar37 = pPVar37 + 1;
    } while (pPVar37 != pPVar4);
    peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  if (peVar24->keep_files_open_set == false) {
    local_518._8_8_ = local_528 + 8;
    local_528._8_8_ = local_528._8_8_ & 0xffffffff00000000;
    local_518._M_allocated_capacity._0_4_ = 0;
    local_518._M_allocated_capacity._4_4_ = 0;
    local_500 = (element_type *)0x0;
    pPVar37 = (peVar24->page_specs).
              super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar4 = *(pointer *)
              ((long)&(peVar24->page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
    local_508._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_;
    if (pPVar37 != pPVar4) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_528,&pPVar37->filename);
        pPVar37 = pPVar37 + 1;
      } while (pPVar37 != pPVar4);
      peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    peVar24->keep_files_open = local_500 <= (element_type *)peVar24->keep_files_open_threshold;
    local_110._8_8_ = 0;
    local_110._M_unused._M_object = local_4f0;
    local_f8 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
               ::_M_invoke;
    local_100 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
                ::_M_manager;
    doIfVerbose(local_4f0,
                (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_110);
    if (local_100 != (code *)0x0) {
      (*local_100)(&local_110,&local_110,__destroy_functor);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_528);
    peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210._M_impl.super__Rb_tree_header._M_header;
  local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_528,
             (peVar24->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (allocator<char> *)&local_4c8);
  ppQVar19 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                           *)&local_2a8,(key_type *)local_528);
  *ppQVar19 = (mapped_type)local_4d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._0_8_ != &local_518) {
    operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
  }
  local_488.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar30 = (ClosedFileInputSource *)
            (peVar24->page_specs).
            super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_460 = *(ClosedFileInputSource **)
               ((long)&(peVar24->page_specs).
                       super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                       _M_impl.super__Vector_impl_data + 8);
  pCVar21 = pCVar30;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar30 != local_460) {
    do {
      local_490 = pCVar21;
      local_4e8 = pCVar30;
      cVar20 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
               ::find(&local_2a8,(key_type *)pCVar30);
      pCVar30 = local_4e8;
      if ((_Rb_tree_header *)cVar20._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
        pcVar38 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_4e8->super_InputSource).buffer)[1]._M_allocated_capacity;
        peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        __n = (peVar24->encryption_file)._M_string_length;
        if (pcVar38 == (char *)0x0 && __n != 0) {
          if (((local_4e8->super_InputSource).last_offset == __n) &&
             (iVar18 = bcmp(((_Alloc_hider *)&(local_4e8->super_InputSource)._vptr_InputSource)->
                            _M_p,(peVar24->encryption_file)._M_dataplus._M_p,__n), iVar18 == 0)) {
            pcVar38 = (peVar24->encryption_file_password).
                      super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          else {
            pcVar38 = (char *)0x0;
          }
        }
        local_318._8_8_ = 0;
        local_318._M_unused._M_object = local_490;
        local_300 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                    ::_M_invoke;
        local_308 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                    ::_M_manager;
        doIfVerbose(local_4f0,
                    (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_318);
        if (local_308 != (code *)0x0) {
          (*local_308)(&local_318,&local_318,__destroy_functor);
        }
        if (((local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->keep_files_open == false) {
          pCVar34 = (ClosedFileInputSource *)operator_new(0xe8);
          ClosedFileInputSource::ClosedFileInputSource
                    (pCVar34,((_Alloc_hider *)&(pCVar30->super_InputSource)._vptr_InputSource)->_M_p
                    );
          local_528._0_8_ = pCVar34;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ClosedFileInputSource*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8),pCVar34);
          QVar32 = (QPDFObjGen)local_528._8_8_;
          pCVar21 = (ClosedFileInputSource *)local_528._0_8_;
          ClosedFileInputSource::stayOpen(pCVar34,true);
        }
        else {
          pCVar21 = (ClosedFileInputSource *)operator_new(0xd8);
          FileInputSource::FileInputSource
                    ((FileInputSource *)pCVar21,
                     ((_Alloc_hider *)&(pCVar30->super_InputSource)._vptr_InputSource)->_M_p);
          local_528._0_8_ = pCVar21;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInputSource*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8),
                     (FileInputSource *)pCVar21);
          pCVar34 = (ClosedFileInputSource *)0x0;
          QVar32 = (QPDFObjGen)local_528._8_8_;
          pCVar21 = (ClosedFileInputSource *)local_528._0_8_;
        }
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        if (QVar32 != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)QVar32 + 8) = *(int *)((long)QVar32 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)QVar32 + 8) = *(int *)((long)QVar32 + 8) + 1;
          }
        }
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        local_348.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &pCVar21->super_InputSource;
        local_348.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QVar32;
        processInputSource(local_4f0,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528,
                           &local_348,pcVar38,true);
        if ((QPDFObjGen)
            local_348.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_348.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar12 = local_528._0_8_;
        pQVar22 = (QPDFObjGen *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                                *)&local_2a8,(key_type *)pCVar30);
        uVar13 = local_528._0_8_;
        local_528._0_4_ = (undefined4)uVar12;
        local_528._4_4_ = SUB84(uVar12,4);
        pQVar22->obj = local_528._0_4_;
        pQVar22->gen = local_528._4_4_;
        local_528._0_8_ = uVar13;
        std::
        vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
        ::emplace_back<std::unique_ptr<QPDF,std::default_delete<QPDF>>>
                  ((vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
                    *)local_4e0,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528);
        if (pCVar34 != (ClosedFileInputSource *)0x0) {
          ClosedFileInputSource::stayOpen(pCVar34,false);
          ppCVar23 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                   *)&local_210,(key_type *)pCVar30);
          *ppCVar23 = pCVar34;
        }
        std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
                  ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528);
        if (QVar32 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QVar32);
        }
      }
      ppQVar19 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                               *)&local_2a8,(key_type *)pCVar30);
      pCVar30 = (ClosedFileInputSource *)
                local_488.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __first = local_488.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      QVar32 = (QPDFObjGen)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4e8->super_InputSource).buffer + 2);
      if (local_488.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_488.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar47 = (long)local_488.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_488.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (uVar47 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar28 = ((long)uVar47 >> 3) * 0x2e8ba2e8ba2e8ba3;
        uVar40 = uVar28;
        if (local_488.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_488.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar40 = 1;
        }
        this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   *)(uVar40 + uVar28);
        if ((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             *)0x1745d1745d1745c < this_06) {
          this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     *)0x1745d1745d1745d;
        }
        if (CARRY8(uVar40,uVar28)) {
          this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     *)0x1745d1745d1745d;
        }
        local_468 = QVar32;
        pCVar21 = (ClosedFileInputSource *)
                  std::
                  _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ::_M_allocate(this_06,(size_t)local_4e8);
        QVar32 = local_468;
        std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
        construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                  ((allocator_type *)((long)pCVar21 + uVar47),(QPDFPageData *)local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppQVar19,
                   (QPDF **)local_468,in_R8);
        pCVar30 = (ClosedFileInputSource *)
                  std::
                  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ::_S_relocate(__first,(pointer)pCVar30,(pointer)pCVar21,(_Tp_alloc_type *)QVar32);
        if ((ClosedFileInputSource *)__first != (ClosedFileInputSource *)0x0) {
          operator_delete(__first,uVar47);
        }
        local_488.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)(pCVar21->super_InputSource).buffer + (long)this_06 * 0x58 + -0x10);
        local_488.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar21;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
        construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                  ((allocator_type *)
                   local_488.
                   super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(QPDFPageData *)local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppQVar19,
                   (QPDF **)QVar32,in_R8);
      }
      local_488.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)(pCVar30->super_InputSource).buffer + 0x48);
      pCVar30 = (ClosedFileInputSource *)
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_4e8->super_InputSource).buffer + 4);
      local_490 = (ClosedFileInputSource *)
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_490->super_InputSource).buffer + 4);
      pCVar21 = local_490;
    } while (pCVar30 != local_460);
    peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  p_Var46 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_02 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var46->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var46->_M_header;
  if ((_Rb_tree_header *)local_2a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2a8._M_impl.super__Rb_tree_header &&
      peVar24->remove_unreferenced_page_resources != re_no) {
    do {
      cVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::find(&local_210,(key_type *)(this_02 + 1));
      if ((_Rb_tree_header *)cVar25._M_node == &local_210._M_impl.super__Rb_tree_header) {
        pCVar30 = (ClosedFileInputSource *)0x0;
      }
      else {
        ppCVar23 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)&local_210,(key_type *)(this_02 + 1));
        pCVar30 = *ppCVar23;
        ClosedFileInputSource::stayOpen(pCVar30,true);
      }
      this_00 = *(QPDF **)(this_02 + 2);
      local_528._0_8_ = QPDF::getUniqueId(this_00);
      p_Var43 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var44 = &p_Var46->_M_header;
      if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00171c67:
        bVar16 = shouldRemoveUnreferencedResources(local_4f0,this_00);
        pmVar26 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                *)&local_90,(key_type_conflict *)local_528);
        *pmVar26 = bVar16;
      }
      else {
        do {
          p_Var36 = p_Var44;
          p_Var33 = p_Var43;
          QVar32.obj = p_Var33[1]._M_color;
          QVar32.gen = *(int *)&p_Var33[1].field_0x4;
          p_Var44 = p_Var33;
          if ((ulong)QVar32 < (ulong)local_528._0_8_) {
            p_Var44 = p_Var36;
          }
          p_Var43 = (&p_Var33->_M_left)[(ulong)QVar32 < (ulong)local_528._0_8_];
        } while ((&p_Var33->_M_left)[(ulong)QVar32 < (ulong)local_528._0_8_] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var44 == p_Var46) goto LAB_00171c67;
        if ((ulong)QVar32 < (ulong)local_528._0_8_) {
          p_Var33 = p_Var36;
        }
        QVar6.obj = p_Var33[1]._M_color;
        QVar6.gen = *(int *)&p_Var33[1].field_0x4;
        if ((ulong)local_528._0_8_ < (ulong)QVar6) goto LAB_00171c67;
      }
      if (pCVar30 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(pCVar30,false);
      }
      this_02 = (_Rb_tree_node_base *)std::_Rb_tree_increment(this_02);
    } while ((_Rb_tree_header *)this_02 != &local_2a8._M_impl.super__Rb_tree_header);
  }
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_manager;
  doIfVerbose(local_4f0,
              (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)&local_230,(QPDF *)local_4d8);
  QPDFPageDocumentHelper::getAllPages(&local_3a0,(QPDFPageDocumentHelper *)&local_230);
  pQVar15 = local_3a0.
            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_02 = &local_230;
    pQVar50 = local_3a0.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar50->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar50->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar50->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar50->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_170.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFPageObjectHelper_002eb088;
      local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pQVar50->m).
               super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pQVar50->m).
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_170.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_170.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      QPDFPageDocumentHelper::removePage((QPDFPageDocumentHelper *)this_02,&local_170);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_170);
      pQVar50 = pQVar50 + 1;
    } while (pQVar50 != pQVar15);
  }
  pCVar30 = (ClosedFileInputSource *)
            local_488.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar7 = (peVar24->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = *(pointer *)
            ((long)&(peVar24->collate).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  p_Var27 = (_Rb_tree_node_base *)((long)puVar8 - (long)puVar7 >> 3);
  local_4e0 = (ClosedFileInputSource *)
              local_488.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  uVar47 = (long)local_488.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_488.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  __n_00 = (_Rb_tree_node_base *)(((long)uVar47 >> 3) * 0x2e8ba2e8ba2e8ba3);
  if (((_Rb_tree_node_base *)0x1 < p_Var27) && ((long)__n_00 - (long)p_Var27 != 0)) {
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "--pages: if --collate has more than one value, it must have one value per page specification"
               ,"");
    usage((string *)local_528);
LAB_0017375e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",this_02);
  }
  pCVar21 = (ClosedFileInputSource *)
            local_488.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((puVar8 != puVar7) && ((_Rb_tree_node_base *)0x1 < __n_00)) {
    local_528._0_4_ = 0;
    local_528._4_4_ = 0;
    local_528._8_4_ = 0;
    local_528._12_4_ = 0;
    local_518._M_allocated_capacity._0_4_ = 0;
    local_518._M_allocated_capacity._4_4_ = 0;
    lVar39 = (long)__n_00 - (long)p_Var27;
    if (p_Var27 <= __n_00 && lVar39 != 0) {
      do {
        peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        __args = (peVar24->collate).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             *(pointer *)
              ((long)&(peVar24->collate).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
        if (__position._M_current == __args) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        if (__position._M_current ==
            *(pointer *)
             ((long)&(peVar24->collate).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&peVar24->collate,
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(unsigned_long **)
           ((long)&(peVar24->collate).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8) = __position._M_current + 1;
        }
        lVar39 = lVar39 + -1;
      } while (lVar39 != 0);
    }
    local_2d8._M_impl._0_8_ = 0;
    local_3f0 = uVar47;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4c8,(size_type)__n_00
               ,(value_type_conflict4 *)&local_2d8,(allocator_type *)&local_c0);
    QVar48.obj = 0;
    QVar48.gen = 0;
    __a_00.obj = 0;
    __a_00.gen = 0;
    this_02 = (_Rb_tree_node_base *)0x0;
    local_3e8 = __n_00;
    bVar16 = false;
    do {
      for (; bVar17 = bVar16, this_02 < __n_00;
          this_02 = (_Rb_tree_node_base *)
                    ((long)&((QPDFDocumentHelper *)&this_02->_M_color)->_vptr_QPDFDocumentHelper + 1
                    )) {
        peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        lVar39 = (long)(peVar24->collate).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((_Rb_tree_node_base *)
            ((long)*(pointer *)
                    ((long)&(peVar24->collate).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8) - lVar39 >> 3) <= this_02) {
LAB_001736f5:
          local_528._0_8_ = QVar48;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     this_02);
        }
        local_4e8 = (ClosedFileInputSource *)
                    ((long)((InputSource *)&((pointer)pCVar30)->filename)->buffer +
                    (long)this_02 * 0x58 + -0x10);
        uVar47 = 0;
        while (uVar40 = *(ulong *)(lVar39 + (long)this_02 * 8), uVar47 < uVar40) {
          if ((_Rb_tree_node_base *)
              ((long)local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
               (long)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper >> 3) <= this_02)
          goto LAB_001736f5;
          piVar45 = (int *)((long)&((((mapped_type)
                                     ((long)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper
                                     + (long)this_02 * 8))->m)._M_t.
                                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                    .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   log + uVar47);
          lVar39 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_4e8->super_InputSource).buffer)[3]._M_allocated_capacity;
          __args_1 = (int *)(*(long *)((long)(local_4e8->super_InputSource).buffer + 0x38) - lVar39
                            >> 2);
          if (piVar45 < __args_1) {
            if (__a_00 == (QPDFObjGen)local_518._M_allocated_capacity) {
              pCVar21 = (ClosedFileInputSource *)((long)__a_00 - (long)QVar48);
              if (pCVar21 == (ClosedFileInputSource *)0x7ffffffffffffff8) {
                local_528._0_8_ = QVar48;
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar28 = ((long)pCVar21 >> 3) * 0x2e8ba2e8ba2e8ba3;
              uVar40 = 1;
              if (__a_00 != QVar48) {
                uVar40 = uVar28;
              }
              pCVar34 = (ClosedFileInputSource *)(uVar40 + uVar28);
              if ((ClosedFileInputSource *)0x1745d1745d1745c < pCVar34) {
                pCVar34 = (ClosedFileInputSource *)0x1745d1745d1745d;
              }
              local_460 = (ClosedFileInputSource *)0x1745d1745d1745d;
              if (!CARRY8(uVar40,uVar28)) {
                local_460 = pCVar34;
              }
              local_490 = pCVar21;
              local_468 = __a_00;
              QVar32 = (QPDFObjGen)
                       std::
                       _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ::_M_allocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                                      *)local_460,(size_t)local_460);
              __a = (_Tp_alloc_type *)
                    ((long)(local_490->super_InputSource).buffer + (long)((long)QVar32 + -0x10));
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        (__a,(QPDFPageData *)local_4e8,
                         (QPDFPageData *)(ulong)*(uint *)(lVar39 + (long)piVar45 * 4),(int *)__a);
              pQVar29 = std::
                        vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ::_S_relocate((pointer)QVar48,(pointer)local_468,(pointer)QVar32,__a);
              if (QVar48 != (QPDFObjGen)0x0) {
                operator_delete((void *)QVar48,(ulong)local_490);
              }
              __a_00 = (QPDFObjGen)(pQVar29 + 1);
              local_518._M_allocated_capacity = (long)QVar32 + (long)local_460 * 0x58;
              bVar17 = true;
              QVar48 = QVar32;
              local_528._8_8_ = __a_00;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        ((allocator_type *)__a_00,(QPDFPageData *)local_4e8,
                         (QPDFPageData *)(ulong)*(uint *)(lVar39 + (long)piVar45 * 4),__args_1);
              __a_00 = (QPDFObjGen)((long)__a_00 + 0x58);
              bVar17 = true;
              local_528._8_8_ = __a_00;
            }
          }
          uVar47 = uVar47 + 1;
          peVar24 = (local_4f0->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          lVar39 = (long)(peVar24->collate).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if ((_Rb_tree_node_base *)
              ((long)*(pointer *)
                      ((long)&(peVar24->collate).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + 8) - lVar39 >> 3) <= this_02)
          goto LAB_001736f5;
        }
        local_528._0_8_ = QVar48;
        if ((_Rb_tree_node_base *)
            ((long)local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
             (long)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper >> 3) <= this_02)
        goto LAB_0017375e;
        pQVar1 = (mapped_type)
                 ((long)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper + (long)this_02 * 8)
        ;
        (pQVar1->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
             ((Members *)
             ((long)&((pQVar1->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log + uVar40)).
             _M_head_impl;
        __n_00 = local_3e8;
        bVar16 = bVar17;
      }
      this_02 = (_Rb_tree_node_base *)0x0;
      bVar16 = false;
    } while (bVar17);
    uVar47 = (long)__a_00 - (long)QVar48;
    if ((ulong)((long)local_488.
                      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar30) < uVar47)
    {
      pCVar30 = (ClosedFileInputSource *)
                std::
                _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::_M_allocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                               *)(((long)uVar47 >> 3) * 0x2e8ba2e8ba2e8ba3),(size_t)__a_00);
      local_4e8 = pCVar30;
      pCVar21 = (ClosedFileInputSource *)
                local_488.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (; local_488.
             super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar21,
          pCVar34 = (ClosedFileInputSource *)
                    local_488.
                    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                    ._M_impl.super__Vector_impl_data._M_start, QVar48 != __a_00;
          QVar48 = (QPDFObjGen)((long)QVar48 + 0x58)) {
        ((_Alloc_hider *)&(pCVar30->super_InputSource)._vptr_InputSource)->_M_p =
             (pointer)(pCVar30->super_InputSource).buffer;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pCVar30,
                   ((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)
                   *(unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)QVar48)._M_t,
                   (long)*(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                           *)((long)QVar48 + 8) +
                   (long)*(unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)QVar48);
        ((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(pCVar30->super_InputSource).buffer + 1))->
        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> =
             (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
             *(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
              ((long)QVar48 + 0x20);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)(pCVar30->super_InputSource).buffer + 0x18),
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)QVar48 + 0x28));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pCVar30->super_InputSource).buffer + 3),
                   (vector<int,_std::allocator<int>_> *)((long)QVar48 + 0x40));
        pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
        pCVar21 = (ClosedFileInputSource *)
                  local_488.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pCVar34 != pCVar21;
          pCVar34 = (ClosedFileInputSource *)((long)(pCVar34->super_InputSource).buffer + 0x48)) {
        pvVar9 = (void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pCVar34->super_InputSource).buffer)[3]._M_allocated_capacity;
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(pCVar34->super_InputSource).buffer)[4]._M_allocated_capacity -
                                 (long)pvVar9);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)(pCVar34->super_InputSource).buffer + 0x18));
        pcVar10 = ((_Alloc_hider *)&(pCVar34->super_InputSource)._vptr_InputSource)->_M_p;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pCVar34->super_InputSource).buffer;
        if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar10) {
          operator_delete(pcVar10,paVar2->_M_allocated_capacity + 1);
        }
      }
      if ((ClosedFileInputSource *)
          local_488.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_start != (ClosedFileInputSource *)0x0) {
        operator_delete(local_488.
                        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_488.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_488.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4e8;
      local_488.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)local_4e8 + uVar47);
    }
    else if (local_3f0 < uVar47) {
      uVar40 = local_3f0;
      if (0 < (long)local_3f0) {
        uVar40 = local_3f0 / 0x58 + 1;
        do {
          std::__cxx11::string::_M_assign((string *)pCVar30);
          ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pCVar30->super_InputSource).buffer + 1))->_M_t =
               (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
               *(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
                ((long)QVar48 + 0x20);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)(pCVar30->super_InputSource).buffer + 0x18),
                     (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)QVar48 + 0x28));
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pCVar30->super_InputSource).buffer + 3),
                     (vector<int,_std::allocator<int>_> *)((long)QVar48 + 0x40));
          uVar40 = uVar40 - 1;
          pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
          QVar48 = (QPDFObjGen)((long)QVar48 + 0x58);
        } while (1 < uVar40);
        local_4e0 = (ClosedFileInputSource *)
                    local_488.
                    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        uVar40 = (long)local_488.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_488.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        __a_00 = (QPDFObjGen)local_528._8_8_;
        QVar48 = (QPDFObjGen)local_528._0_8_;
      }
      pCVar30 = local_4e0;
      for (QVar48 = (QPDFObjGen)(uVar40 + (long)QVar48); QVar48 != __a_00;
          QVar48 = (QPDFObjGen)((long)QVar48 + 0x58)) {
        ((_Alloc_hider *)&(pCVar30->super_InputSource)._vptr_InputSource)->_M_p =
             (pointer)(pCVar30->super_InputSource).buffer;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pCVar30,
                   (__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)
                   *(unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)QVar48,
                   (long)*(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                           *)((long)QVar48 + 8) +
                   (long)*(unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)QVar48);
        ((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(pCVar30->super_InputSource).buffer + 1))->
        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> =
             (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
             *(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
              ((long)QVar48 + 0x20);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)(pCVar30->super_InputSource).buffer + 0x18),
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)QVar48 + 0x28));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pCVar30->super_InputSource).buffer + 3),
                   (vector<int,_std::allocator<int>_> *)((long)QVar48 + 0x40));
        pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
      }
    }
    else {
      pCVar21 = pCVar30;
      pCVar34 = local_4e0;
      if (0 < (long)uVar47) {
        uVar40 = uVar47 / 0x58 + 1;
        do {
          pCVar34 = pCVar21;
          std::__cxx11::string::_M_assign((string *)pCVar34);
          ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pCVar34->super_InputSource).buffer + 1))->_M_t =
               (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
               *(__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
                ((long)QVar48 + 0x20);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)(pCVar34->super_InputSource).buffer + 0x18),
                     (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)QVar48 + 0x28));
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pCVar34->super_InputSource).buffer + 3),
                     (vector<int,_std::allocator<int>_> *)((long)QVar48 + 0x40));
          uVar40 = uVar40 - 1;
          pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
          QVar48 = (QPDFObjGen)((long)QVar48 + 0x58);
          pCVar21 = (ClosedFileInputSource *)((long)(pCVar34->super_InputSource).buffer + 0x48);
        } while (1 < uVar40);
        pCVar21 = (ClosedFileInputSource *)((long)(pCVar34->super_InputSource).buffer + 0x48);
        pCVar34 = (ClosedFileInputSource *)
                  local_488.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      while (pCVar21 != pCVar34) {
        pvVar9 = (void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pCVar30->super_InputSource).buffer)[3]._M_allocated_capacity;
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(pCVar30->super_InputSource).buffer)[4]._M_allocated_capacity -
                                 (long)pvVar9);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)(pCVar30->super_InputSource).buffer + 0x18));
        pcVar10 = ((_Alloc_hider *)&(pCVar30->super_InputSource)._vptr_InputSource)->_M_p;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pCVar30->super_InputSource).buffer;
        if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar10) {
          operator_delete(pcVar10,paVar2->_M_allocated_capacity + 1);
        }
        pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
        pCVar21 = pCVar30;
      }
    }
    pCVar30 = (ClosedFileInputSource *)
              local_488.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar21 = (ClosedFileInputSource *)
              (uVar47 + (long)local_488.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    local_488.
    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar21;
    if ((QPDFObjGen)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != (QPDFObjGen)0x0) {
      operator_delete(local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (long)local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi - (long)local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper);
    }
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
               *)local_528);
  }
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_468 = (QPDFObjGen)
              get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                 *)&local_c0,(QPDF *)local_4d8);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar39 = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (pCVar30 != pCVar21) {
    local_4e8 = (ClosedFileInputSource *)&PTR__QPDFObjectHelper_002edce8;
    uVar47 = 0;
    local_2e0 = pCVar21;
    do {
      cVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::find(&local_210,(key_type *)pCVar30);
      if ((_Rb_tree_header *)cVar25._M_node == &local_210._M_impl.super__Rb_tree_header) {
        local_4e0 = (ClosedFileInputSource *)0x0;
      }
      else {
        ppCVar23 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)&local_210,(key_type *)pCVar30);
        local_4e0 = *ppCVar23;
        ClosedFileInputSource::stayOpen(local_4e0,true);
      }
      QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
                ((QPDFPageLabelDocumentHelper *)&local_438,
                 (QPDF *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pCVar30->super_InputSource).buffer)[1]._M_allocated_capacity);
      local_490 = (ClosedFileInputSource *)
                  get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                     *)&local_c0,
                                    (QPDF *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)(pCVar30->super_InputSource).buffer)[1].
                                            _M_allocated_capacity);
      bVar16 = QPDFPageLabelDocumentHelper::hasPageLabels((QPDFPageLabelDocumentHelper *)&local_438)
      ;
      local_3e8 = (_Rb_tree_node_base *)CONCAT71(local_3e8._1_7_,bVar16);
      local_338._8_8_ = 0;
      local_320 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                  ::_M_invoke;
      local_328 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                  ::_M_manager;
      local_338._M_unused._0_8_ = (undefined8)pCVar30;
      doIfVerbose(local_4f0,
                  (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_338);
      local_3f0 = uVar47;
      if (local_328 != (code *)0x0) {
        (*local_328)(&local_338,&local_338,__destroy_functor);
      }
      pCVar21 = (ClosedFileInputSource *)
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pCVar30->super_InputSource).buffer)[3]._M_allocated_capacity;
      local_460 = *(ClosedFileInputSource **)((long)(pCVar30->super_InputSource).buffer + 0x38);
      if (pCVar21 != local_460) {
        lVar39 = (long)(int)lVar39;
        do {
          p_Var46 = &local_2d8._M_impl.super__Rb_tree_header;
          lVar35 = (long)*(int *)&((_Alloc_hider *)&(pCVar21->super_InputSource)._vptr_InputSource)
                                  ->_M_p + -1;
          local_4cc = (int)lVar35;
          QPDFPageLabelDocumentHelper::getLabelsForPageRange
                    ((QPDFPageLabelDocumentHelper *)&local_438,lVar35,lVar35,lVar39,&local_2f8);
          if (local_4cc < 0) {
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_4cc);
          }
          lVar35 = *(long *)((long)(pCVar30->super_InputSource).buffer + 0x18);
          if ((ulong)((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pCVar30->super_InputSource).buffer)[2]._M_allocated_capacity -
                            lVar35) >> 4) <= (ulong)(long)local_4cc) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          lVar41 = (long)local_4cc * 0x10;
          local_358.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)(lVar35 + lVar41);
          local_358.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar35 + 8 + lVar41);
          if (local_358.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_358.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_358.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_358.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_358.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528,&local_358);
          if (local_358.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_358.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)local_528._8_8_;
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_3a8 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_4c8);
          if ((QPDFObjGen)
              local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          local_3e0 = QPDF::getUniqueId((QPDF *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(pCVar30->super_InputSource).buffer)[1].
                                                _M_allocated_capacity);
          this_03 = &std::
                     map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                   *)&local_60,&local_3e0)->_M_t;
          cVar31 = std::
                   _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   ::find(this_03,&local_3a8);
          if ((_Rb_tree_header *)cVar31._M_node == &(this_03->_M_impl).super__Rb_tree_header) {
            this_04 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                       *)std::
                         map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                         ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                       *)&local_60,&local_3e0);
            std::
            _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
            ::_M_insert_unique<QPDFObjGen_const&>(this_04,&local_3a8);
            pmVar26 = std::
                      map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                      ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                    *)&local_90,&local_3e0);
            if (*pmVar26 == true) {
              QPDFPageObjectHelper::removeUnreferencedResources((QPDFPageObjectHelper *)local_528);
            }
          }
          else {
            QPDFPageObjectHelper::shallowCopyPage
                      ((QPDFPageObjectHelper *)&local_4c8,(QPDFPageObjectHelper *)local_528);
            local_528._8_8_ =
                 local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_518._M_allocated_capacity,
                       &local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            local_518._8_8_ =
                 local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_508,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
            local_500 = (element_type *)
                        local_4c8.m.
                        super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_4f8,
                       &local_4c8.m.
                        super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&local_4c8);
          }
          local_1a8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_528._8_8_;
          local_1a8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_1a8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._8_8_;
          local_1a8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_508._M_pi;
          if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            }
          }
          local_1a8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFPageObjectHelper_002eb088;
          local_1a8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_500;
          local_1a8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_4f8._M_pi;
          if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            }
          }
          QPDFPageDocumentHelper::addPage((QPDFPageDocumentHelper *)&local_230,&local_1a8,false);
          QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1a8);
          pQVar11 = (QPDFObjectHandle *)
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pCVar30->super_InputSource).buffer)[1]._M_allocated_capacity;
          if (pQVar11 == local_4d8) {
            p_Var43 = &p_Var46->_M_header;
            p_Var44 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var33 = &p_Var46->_M_header;
            if (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              do {
                p_Var36 = p_Var44;
                p_Var42 = p_Var43;
                _Var3 = p_Var36[1]._M_color;
                p_Var43 = p_Var36;
                if ((int)_Var3 < local_4cc) {
                  p_Var43 = p_Var42;
                }
                p_Var44 = (&p_Var36->_M_left)[(int)_Var3 < local_4cc];
              } while ((&p_Var36->_M_left)[(int)_Var3 < local_4cc] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var43 != p_Var46) {
                if ((int)_Var3 < local_4cc) {
                  p_Var36 = p_Var42;
                }
                p_Var33 = p_Var43;
                if (local_4cc < (int)p_Var36[1]._M_color) {
                  p_Var33 = &p_Var46->_M_header;
                }
              }
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_2d8,&local_4cc);
            bVar16 = (_Rb_tree_header *)p_Var33 == &local_2d8._M_impl.super__Rb_tree_header;
          }
          else {
            bVar16 = false;
          }
          local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_528._8_8_;
          local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_278.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._8_8_;
          local_278.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_508._M_pi;
          if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            }
          }
          local_278.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFPageObjectHelper_002eb088;
          local_278.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_500;
          local_278.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_4f8._M_pi;
          if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            }
          }
          local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)
               local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((QPDFObjGen)
              local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 8) =
                   *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 8) =
                   *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 8) + 1;
            }
          }
          added_page((QPDF *)&local_3b8,local_4d8);
          if ((QPDFObjGen)
              local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_278);
          if (pQVar11 == local_4d8) {
            if (!bVar16) goto LAB_00172af9;
          }
          else {
            bVar17 = QPDFAcroFormDocumentHelper::hasAcroForm
                               ((QPDFAcroFormDocumentHelper *)local_490);
            if (bVar17 || !bVar16) {
LAB_00172af9:
              local_368.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_3b8;
              local_368.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_3b0;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
                }
              }
              local_378.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_528._8_8_;
              local_378.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
              if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_518._M_allocated_capacity + 8) =
                       *(int *)(local_518._M_allocated_capacity + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_518._M_allocated_capacity + 8) =
                       *(int *)(local_518._M_allocated_capacity + 8) + 1;
                }
              }
              QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                        ((QPDFAcroFormDocumentHelper *)local_468,&local_368,&local_378,
                         (QPDFAcroFormDocumentHelper *)local_490,
                         (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                         &local_f0);
              if ((QPDFObjGen)
                  local_378.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (QPDFObjGen)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_378.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if (local_368.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_368.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
          }
          if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
          }
          lVar39 = lVar39 + 1;
          QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528);
          pCVar21 = (ClosedFileInputSource *)
                    ((long)&((_Alloc_hider *)&(pCVar21->super_InputSource)._vptr_InputSource)->_M_p
                    + 4);
        } while (pCVar21 != local_460);
      }
      uVar47 = local_3f0;
      if (local_4e0 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(local_4e0,false);
      }
      bVar49 = (byte)uVar47 | (byte)local_3e8;
      uVar47 = CONCAT71((int7)(uVar47 >> 8),bVar49);
      QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
                ((QPDFPageLabelDocumentHelper *)&local_438);
      pCVar30 = (ClosedFileInputSource *)((long)(pCVar30->super_InputSource).buffer + 0x48);
    } while (pCVar30 != local_2e0);
    if ((bVar49 & 1) != 0) {
      QPDFObjectHandle::newDictionary();
      local_528._0_8_ = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Nums","");
      QPDFObjectHandle::newArray((QPDFObjectHandle *)&local_438,&local_2f8);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_4c8,(string *)local_528,(QPDFObjectHandle *)&local_438);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
      }
      QPDF::getRoot((QPDF *)&local_438);
      local_528._0_8_ = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/PageLabels","");
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_438,(string *)local_528,(QPDFObjectHandle *)&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length);
      }
      if ((QPDFObjGen)
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
  }
  if (local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar47 = 0;
    do {
      p_Var46 = &local_2d8._M_impl.super__Rb_tree_header;
      local_528._8_8_ =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar47].super_QPDFObjectHelper.super_BaseHandle
           .obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      QVar32 = (QPDFObjGen)
               local_3a0.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar47].super_QPDFObjectHelper.
               super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      local_518._M_allocated_capacity._0_4_ = QVar32.obj;
      local_518._M_allocated_capacity._4_4_ = QVar32.gen;
      if (QVar32 != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)QVar32 + 8) = *(int *)((long)QVar32 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)QVar32 + 8) = *(int *)((long)QVar32 + 8) + 1;
        }
      }
      local_518._8_8_ =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar47].super_QPDFObjectHelper.oh_.
           super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_508._M_pi =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar47].super_QPDFObjectHelper.oh_.
           super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent + 1;
        }
      }
      local_528._0_8_ = &PTR__QPDFPageObjectHelper_002eb088;
      local_500 = local_3a0.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar47].m.
                  super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_4f8._M_pi =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar47].m.
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
        }
      }
      if (uVar47 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar47);
      }
      p_Var43 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var44 = &p_Var46->_M_header;
      if (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0017301d:
        local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)local_528._8_8_;
        local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_518._M_allocated_capacity;
        if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
          }
        }
        QVar32 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_4c8);
        QPDFObjectHandle::newNull();
        QPDF::replaceObject((QPDF *)local_4d8,QVar32,&local_240);
        if (local_240.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_240.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((QPDFObjGen)
            local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        do {
          p_Var36 = p_Var44;
          p_Var33 = p_Var43;
          _Var3 = p_Var33[1]._M_color;
          iVar18 = (int)uVar47;
          p_Var44 = p_Var33;
          if ((int)_Var3 < iVar18) {
            p_Var44 = p_Var36;
          }
          p_Var43 = (&p_Var33->_M_left)[(int)_Var3 < iVar18];
        } while ((&p_Var33->_M_left)[(int)_Var3 < iVar18] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var44 == p_Var46) goto LAB_0017301d;
        if ((int)_Var3 < iVar18) {
          p_Var33 = p_Var36;
        }
        if (iVar18 < (int)p_Var33[1]._M_color) goto LAB_0017301d;
        local_1e0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_528._8_8_;
        local_1e0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
        if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
          }
        }
        local_1e0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_518._8_8_;
        local_1e0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_508._M_pi;
        if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
          }
        }
        local_1e0.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)&PTR__QPDFPageObjectHelper_002eb088;
        local_1e0.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_500;
        local_1e0.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_4f8._M_pi;
        if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
          }
        }
        QPDFAcroFormDocumentHelper::getFormFieldsForPage
                  ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                   &local_438,(QPDFAcroFormDocumentHelper *)local_468,&local_1e0);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1e0);
        sVar14 = local_438._M_string_length;
        for (_Var51._M_p = local_438._M_dataplus._M_p; _Var51._M_p != (pointer)sVar14;
            _Var51._M_p = (pointer)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)_Var51._M_p + 0x30))->_M_use_count) {
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var51._M_p)->_M_use_count;
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var51._M_p)->_M_weak_count;
          local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var51._M_p + 0x10))->
               _vptr__Sp_counted_base;
          if (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var51._M_p + 0x10))->
                 _M_use_count;
          local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var51._M_p + 0x20))->
               _vptr__Sp_counted_base;
          if (local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_4c8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFFormFieldObjectHelper_002eb018;
          local_4c8.m.
          super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = *(element_type **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var51._M_p + 0x20))->
                   _M_use_count;
          local_4c8.m.
          super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var51._M_p + 0x30))->
               _vptr__Sp_counted_base;
          if (local_4c8.m.
              super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4c8.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4c8.m.
                    super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4c8.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4c8.m.
                    super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          if (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_458[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_458[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_418[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)QPDFObjectHandle::getObjGen(local_458);
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>(&local_f0,(QPDFObjGen *)local_418);
          if (local_458[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_458[0].super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_4c8);
        }
        std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
                  ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                   &local_438);
      }
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528);
      uVar47 = uVar47 + 1;
    } while (uVar47 < (ulong)(((long)local_3a0.
                                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_3a0.
                                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  bVar16 = QPDFAcroFormDocumentHelper::hasAcroForm((QPDFAcroFormDocumentHelper *)local_468);
  if (bVar16) {
    QPDF::getRoot((QPDF *)&local_4c8);
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/AcroForm","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_438,(string *)&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
    }
    if ((QPDFObjGen)
        local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Fields","");
    QPDFObjectHandle::getKey(local_458,&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
    }
    bVar16 = QPDFObjectHandle::isArray(local_458);
    if (bVar16) {
      QPDFObjectHandle::newArray();
      bVar16 = QPDFObjectHandle::isIndirect(local_458);
      if (bVar16) {
        local_388 = (QPDFObjGen)
                    local_418[0].super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_380 = (QPDFObjGen)
                    local_418[0].super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)
            local_418[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)local_418[0].super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 8) =
                 *(int *)((long)local_418[0].super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)local_418[0].super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 8) =
                 *(int *)((long)local_418[0].super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 8) + 1;
          }
        }
        QPDF::makeIndirectObject((QPDF *)local_528,local_4d8);
        this_01._M_pi =
             local_418[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_418[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_;
        local_418[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_528._0_8_;
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        local_528._8_4_ = 0;
        local_528._12_4_ = 0;
        if (((QPDFObjGen)this_01._M_pi != (QPDFObjGen)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi),
           (QPDFObjGen)local_528._8_8_ != (QPDFObjGen)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_);
        }
        if (local_380 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_380);
        }
      }
      QPDFObjectHandle::aitems(local_458);
      QPDFObjectHandle::QPDFArrayItems::begin((iterator *)local_528,local_3d8);
      QPDFObjectHandle::QPDFArrayItems::end((iterator *)&local_4c8,local_3d8);
      while (bVar16 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                                ((iterator *)local_528,(iterator *)&local_4c8), !bVar16) {
        this_05 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_528);
        local_3b8 = QPDFObjectHandle::getObjGen(this_05);
        cVar31 = std::
                 _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 ::find(&local_f0,&local_3b8);
        if ((_Rb_tree_header *)cVar31._M_node != &local_f0._M_impl.super__Rb_tree_header) {
          QPDFObjectHandle::appendItem(local_418,this_05);
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_528);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_4c8);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_528);
      if (local_3d8[0].oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3d8[0].oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      iVar18 = QPDFObjectHandle::getArrayNItems(local_418);
      if (iVar18 < 1) {
        QPDF::getRoot((QPDF *)&local_4c8);
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/AcroForm","");
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_4c8,(string *)local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
        }
        if ((QPDFObjGen)
            local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4c8.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Fields","");
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_438,(string *)local_528,local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
        }
      }
      if ((QPDFObjGen)
          local_418[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_418[0].super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if (local_458[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_458[0].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length);
    }
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_2f8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2d8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_3a0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_230);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ::~vector(&local_488);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  ::~_Rb_tree(&local_210);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  ::~_Rb_tree(&local_2a8);
  return;
}

Assistant:

void
QPDFJob::handlePageSpecs(QPDF& pdf, std::vector<std::unique_ptr<QPDF>>& page_heap)
{
    // Parse all page specifications and translate them into lists of actual pages.

    // Handle "." as a shortcut for the input file
    for (auto& page_spec: m->page_specs) {
        if (page_spec.filename == ".") {
            page_spec.filename = m->infilename.get();
        }
        if (page_spec.range.empty()) {
            page_spec.range = "1-z";
        }
    }

    if (!m->keep_files_open_set) {
        // Count the number of distinct files to determine whether we should keep files open or not.
        // Rather than trying to code some portable heuristic based on OS limits, just hard-code
        // this at a given number and allow users to override.
        std::set<std::string> filenames;
        for (auto& page_spec: m->page_specs) {
            filenames.insert(page_spec.filename);
        }
        m->keep_files_open = (filenames.size() <= m->keep_files_open_threshold);
        QTC::TC("qpdf", "QPDFJob automatically set keep files open", m->keep_files_open ? 0 : 1);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": selecting --keep-open-files=" << (m->keep_files_open ? "y" : "n")
              << "\n";
        });
    }

    // Create a QPDF object for each file that we may take pages from.
    std::map<std::string, QPDF*> page_spec_qpdfs;
    std::map<std::string, ClosedFileInputSource*> page_spec_cfis;
    page_spec_qpdfs[m->infilename.get()] = &pdf;
    std::vector<QPDFPageData> parsed_specs;
    std::map<unsigned long long, std::set<QPDFObjGen>> copied_pages;
    for (auto& page_spec: m->page_specs) {
        if (page_spec_qpdfs.count(page_spec.filename) == 0) {
            // Open the PDF file and store the QPDF object. Throw a std::shared_ptr to the qpdf into
            // a heap so that it survives through copying to the output but gets cleaned up
            // automatically at the end. Do not canonicalize the file name. Using two different
            // paths to refer to the same file is a documented workaround for duplicating a page. If
            // you are using this an example of how to do this with the API, you can just create two
            // different QPDF objects to the same underlying file with the same path to achieve the
            // same effect.
            char const* password = page_spec.password.get();
            if ((!m->encryption_file.empty()) && (password == nullptr) &&
                (page_spec.filename == m->encryption_file)) {
                QTC::TC("qpdf", "QPDFJob pages encryption password");
                password = m->encryption_file_password.get();
            }
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": processing " << page_spec.filename << "\n";
            });
            std::shared_ptr<InputSource> is;
            ClosedFileInputSource* cis = nullptr;
            if (!m->keep_files_open) {
                QTC::TC("qpdf", "QPDFJob keep files open n");
                cis = new ClosedFileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(cis);
                cis->stayOpen(true);
            } else {
                QTC::TC("qpdf", "QPDFJob keep files open y");
                FileInputSource* fis = new FileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(fis);
            }
            std::unique_ptr<QPDF> qpdf_sp;
            processInputSource(qpdf_sp, is, password, true);
            page_spec_qpdfs[page_spec.filename] = qpdf_sp.get();
            page_heap.push_back(std::move(qpdf_sp));
            if (cis) {
                cis->stayOpen(false);
                page_spec_cfis[page_spec.filename] = cis;
            }
        }

        // Read original pages from the PDF, and parse the page range associated with this
        // occurrence of the file.
        parsed_specs.emplace_back(
            page_spec.filename, page_spec_qpdfs[page_spec.filename], page_spec.range);
    }

    std::map<unsigned long long, bool> remove_unreferenced;
    if (m->remove_unreferenced_page_resources != QPDFJob::re_no) {
        for (auto const& iter: page_spec_qpdfs) {
            std::string const& filename = iter.first;
            ClosedFileInputSource* cis = nullptr;
            if (page_spec_cfis.count(filename)) {
                cis = page_spec_cfis[filename];
                cis->stayOpen(true);
            }
            QPDF& other(*(iter.second));
            auto other_uuid = other.getUniqueId();
            if (remove_unreferenced.count(other_uuid) == 0) {
                remove_unreferenced[other_uuid] = shouldRemoveUnreferencedResources(other);
            }
            if (cis) {
                cis->stayOpen(false);
            }
        }
    }

    // Clear all pages out of the primary QPDF's pages tree but leave the objects in place in the
    // file so they can be re-added without changing their object numbers. This enables other things
    // in the original file, such as outlines, to continue to work.
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": removing unreferenced pages from primary input\n";
    });
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> orig_pages = dh.getAllPages();
    for (auto const& page: orig_pages) {
        dh.removePage(page);
    }

    auto n_collate = m->collate.size();
    auto n_specs = parsed_specs.size();
    if (!(n_collate == 0 || n_collate == 1 || n_collate == n_specs)) {
        usage(
            "--pages: if --collate has more than one value, it must have one value per page "
            "specification");
    }
    if (n_collate > 0 && n_specs > 1) {
        // Collate the pages by selecting one page from each spec in order. When a spec runs out of
        // pages, stop selecting from it.
        std::vector<QPDFPageData> new_parsed_specs;
        // Make sure we have a collate value for each spec. We have already checked that a non-empty
        // collate has either one value or one value per spec.
        for (auto i = n_collate; i < n_specs; ++i) {
            m->collate.push_back(m->collate.at(0));
        }
        std::vector<size_t> cur_page(n_specs, 0);
        bool got_pages = true;
        while (got_pages) {
            got_pages = false;
            for (size_t i = 0; i < n_specs; ++i) {
                QPDFPageData& page_data = parsed_specs.at(i);
                for (size_t j = 0; j < m->collate.at(i); ++j) {
                    if (cur_page.at(i) + j < page_data.selected_pages.size()) {
                        got_pages = true;
                        new_parsed_specs.emplace_back(
                            page_data, page_data.selected_pages.at(cur_page.at(i) + j));
                    }
                }
                cur_page.at(i) += m->collate.at(i);
            }
        }
        parsed_specs = new_parsed_specs;
    }

    // Add all the pages from all the files in the order specified. Keep track of any pages from the
    // original file that we are selecting.
    std::set<int> selected_from_orig;
    std::vector<QPDFObjectHandle> new_labels;
    bool any_page_labels = false;
    int out_pageno = 0;
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh_map;
    auto this_afdh = get_afdh_for_qpdf(afdh_map, &pdf);
    std::set<QPDFObjGen> referenced_fields;
    for (auto& page_data: parsed_specs) {
        ClosedFileInputSource* cis = nullptr;
        if (page_spec_cfis.count(page_data.filename)) {
            cis = page_spec_cfis[page_data.filename];
            cis->stayOpen(true);
        }
        QPDFPageLabelDocumentHelper pldh(*page_data.qpdf);
        auto other_afdh = get_afdh_for_qpdf(afdh_map, page_data.qpdf);
        if (pldh.hasPageLabels()) {
            any_page_labels = true;
        }
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": adding pages from " << page_data.filename << "\n";
        });
        for (auto pageno_iter: page_data.selected_pages) {
            // Pages are specified from 1 but numbered from 0 in the vector
            int pageno = pageno_iter - 1;
            pldh.getLabelsForPageRange(pageno, pageno, out_pageno++, new_labels);
            QPDFPageObjectHelper to_copy = page_data.orig_pages.at(QIntC::to_size(pageno));
            QPDFObjGen to_copy_og = to_copy.getObjectHandle().getObjGen();
            unsigned long long from_uuid = page_data.qpdf->getUniqueId();
            if (copied_pages[from_uuid].count(to_copy_og)) {
                QTC::TC(
                    "qpdf",
                    "QPDFJob copy same page more than once",
                    (page_data.qpdf == &pdf) ? 0 : 1);
                to_copy = to_copy.shallowCopyPage();
            } else {
                copied_pages[from_uuid].insert(to_copy_og);
                if (remove_unreferenced[from_uuid]) {
                    to_copy.removeUnreferencedResources();
                }
            }
            dh.addPage(to_copy, false);
            bool first_copy_from_orig = false;
            bool this_file = (page_data.qpdf == &pdf);
            if (this_file) {
                // This is a page from the original file. Keep track of the fact that we are using
                // it.
                first_copy_from_orig = (selected_from_orig.count(pageno) == 0);
                selected_from_orig.insert(pageno);
            }
            auto new_page = added_page(pdf, to_copy);
            // Try to avoid gratuitously renaming fields. In the case of where we're just extracting
            // a bunch of pages from the original file and not copying any page more than once,
            // there's no reason to do anything with the fields. Since we don't remove fields from
            // the original file until all copy operations are completed, any foreign pages that
            // conflict with original pages will be adjusted. If we copy any page from the original
            // file more than once, that page would be in conflict with the previous copy of itself.
            if ((!this_file && other_afdh->hasAcroForm()) || !first_copy_from_orig) {
                if (!this_file) {
                    QTC::TC("qpdf", "QPDFJob copy fields not this file");
                } else if (!first_copy_from_orig) {
                    QTC::TC("qpdf", "QPDFJob copy fields non-first from orig");
                }
                try {
                    this_afdh->fixCopiedAnnotations(
                        new_page, to_copy.getObjectHandle(), *other_afdh, &referenced_fields);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug. " +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (cis) {
            cis->stayOpen(false);
        }
    }
    if (any_page_labels) {
        QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(new_labels));
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }

    // Delete page objects for unused page in primary. This prevents those objects from being
    // preserved by being referred to from other places, such as the outlines dictionary. Also make
    // sure we keep form fields from pages we preserved.
    for (size_t pageno = 0; pageno < orig_pages.size(); ++pageno) {
        auto page = orig_pages.at(pageno);
        if (selected_from_orig.count(QIntC::to_int(pageno))) {
            for (auto field: this_afdh->getFormFieldsForPage(page)) {
                QTC::TC("qpdf", "QPDFJob pages keeping field from original");
                referenced_fields.insert(field.getObjectHandle().getObjGen());
            }
        } else {
            pdf.replaceObject(page.getObjectHandle().getObjGen(), QPDFObjectHandle::newNull());
        }
    }
    // Remove unreferenced form fields
    if (this_afdh->hasAcroForm()) {
        auto acroform = pdf.getRoot().getKey("/AcroForm");
        auto fields = acroform.getKey("/Fields");
        if (fields.isArray()) {
            auto new_fields = QPDFObjectHandle::newArray();
            if (fields.isIndirect()) {
                new_fields = pdf.makeIndirectObject(new_fields);
            }
            for (auto const& field: fields.aitems()) {
                if (referenced_fields.count(field.getObjGen())) {
                    new_fields.appendItem(field);
                }
            }
            if (new_fields.getArrayNItems() > 0) {
                QTC::TC("qpdf", "QPDFJob keep some fields in pages");
                acroform.replaceKey("/Fields", new_fields);
            } else {
                QTC::TC("qpdf", "QPDFJob no more fields in pages");
                pdf.getRoot().removeKey("/AcroForm");
            }
        }
    }
}